

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

PyObject * pybind11::detail::dict_getitemstring(PyObject *v,char *key)

{
  long *plVar1;
  PyObject *pPVar2;
  long lVar3;
  error_already_set *this;
  
  plVar1 = (long *)PyUnicode_FromString(key);
  if (plVar1 == (long *)0x0) {
    this = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this);
LAB_00114519:
    __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  pPVar2 = (PyObject *)PyDict_GetItemWithError(v,plVar1);
  *plVar1 = *plVar1 + -1;
  if (*plVar1 == 0) {
    _Py_Dealloc(plVar1);
  }
  if (pPVar2 == (PyObject *)0x0) {
    lVar3 = PyErr_Occurred();
    if (lVar3 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      goto LAB_00114519;
    }
  }
  return pPVar2;
}

Assistant:

inline PyObject * dict_getitemstring(PyObject *v, const char *key)
{
#if PY_MAJOR_VERSION >= 3
    PyObject *kv = nullptr, *rv = nullptr;
    kv = PyUnicode_FromString(key);
    if (kv == NULL) {
        throw error_already_set();
    }

    rv = PyDict_GetItemWithError(v, kv);
    Py_DECREF(kv);
    if (rv == NULL && PyErr_Occurred()) {
        throw error_already_set();
    }
    return rv;
#else
    return PyDict_GetItemString(v, key);
#endif
}